

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O0

bool __thiscall SQArray::Set(SQArray *this,SQInteger nidx,SQObjectPtr *val)

{
  size_type sVar1;
  SQObjectPtr *in_RDX;
  SQObjectPtr *in_RSI;
  long in_RDI;
  bool bVar2;
  SQObjectPtr *obj;
  
  obj = in_RSI;
  sVar1 = sqvector<SQObjectPtr,_unsigned_int>::size
                    ((sqvector<SQObjectPtr,_unsigned_int> *)(in_RDI + 0x30));
  bVar2 = obj < (SQObjectPtr *)(ulong)sVar1;
  if (bVar2) {
    sqvector<SQObjectPtr,_unsigned_int>::operator[]
              ((sqvector<SQObjectPtr,_unsigned_int> *)(in_RDI + 0x30),(size_type)in_RSI);
    ::SQObjectPtr::operator=(in_RDX,obj);
  }
  return bVar2;
}

Assistant:

bool Set(const SQInteger nidx,const SQObjectPtr &val)
    {
        if((SQUnsignedInteger)nidx<(SQUnsignedInteger)_values.size()){
            _values[nidx]=val;
            VT_TRACE(nidx, val, _ss(this)->_root_vm);
            return true;
        }
        else return false;
    }